

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

void evmap_io_active_(event_base *base,int fd,short events)

{
  event *ev;
  ushort uVar1;
  anon_union_32_2_36317463_for_ev_ *paVar2;
  
  if (((-1 < fd) && (fd < (base->io).nentries)) &&
     (paVar2 = (anon_union_32_2_36317463_for_ev_ *)(base->io).entries[(uint)fd],
     paVar2 != (anon_union_32_2_36317463_for_ev_ *)0x0)) {
    while (ev = (paVar2->ev_io).ev_io_next.le_next, ev != (event *)0x0) {
      uVar1 = ev->ev_events & events;
      if (uVar1 != 0) {
        event_active_nolock_(ev,(int)(short)uVar1,1);
      }
      paVar2 = &ev->ev_;
    }
  }
  return;
}

Assistant:

void
evmap_io_active_(struct event_base *base, evutil_socket_t fd, short events)
{
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx;
	struct event *ev;

#ifndef EVMAP_USE_HT
	if (fd < 0 || fd >= io->nentries)
		return;
#endif
	GET_IO_SLOT(ctx, io, fd, evmap_io);

	if (NULL == ctx)
		return;
	LIST_FOREACH(ev, &ctx->events, ev_io_next) {
		if (ev->ev_events & events)
			event_active_nolock_(ev, ev->ev_events & events, 1);
	}
}